

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2h> *value)

{
  bool bVar1;
  undefined7 in_register_00000001;
  texcoord2h v;
  storage_t<tinyusdz::value::texcoord2h> local_14;
  
  local_14 = SUB74((uint7)in_register_00000001 >> 0x18,0);
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,(texcoord2h *)&local_14);
    if (bVar1) {
      if (value->has_value_ == true) {
        value->contained = local_14;
      }
      else {
        value->contained = local_14;
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2h> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2h v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}